

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O1

bool __thiscall
miniros::NodeHandle::getParamNames
          (NodeHandle *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  bool bVar1;
  TopicManagerPtr *pTVar2;
  MasterLink *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  pTVar2 = TopicManager::instance();
  TopicManager::getMasterLink
            ((pTVar2->super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  bVar1 = MasterLink::getParamNames(local_20,keys);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return bVar1;
}

Assistant:

bool NodeHandle::getParamNames(std::vector<std::string>& keys) const
{
  return getMasterLink()->getParamNames(keys);
}